

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

int findrec(int *a,int *b,int *c)

{
  undefined8 local_48;
  double mul;
  double dc;
  double db;
  double da;
  int rec;
  int *c_local;
  int *b_local;
  int *a_local;
  
  db = (double)*a;
  dc = (double)*b;
  da._4_4_ = 0;
  local_48 = 1.0;
  for (mul = (double)*c; 192.0 < db + dc + mul; mul = ceil(mul / 2.0)) {
    da._4_4_ = da._4_4_ + 1;
    local_48 = local_48 * 2.0;
    db = ceil(db / 2.0);
    dc = ceil(dc / 2.0);
  }
  *a = (int)((double)(int)db * local_48);
  *b = (int)((double)(int)dc * local_48);
  *c = (int)((double)(int)mul * local_48);
  return da._4_4_;
}

Assistant:

int findrec(int *a, int *b, int *c) {
	int rec;
	double da,db,dc,mul;
	da = (double) *a;
	db = (double) *b;
	dc = (double) *c;
	rec = 0;
	mul = 1.;
	
	while (da + db + dc > (double) CUTOFF) {
		rec++;
		mul *= 2;
		da = ceil(da/2.);
		db = ceil(db/2.);
		dc = ceil(dc/2.);
	}
	*a = (int) da * mul;
	*b = (int) db * mul;
	*c = (int) dc * mul;
	
	return rec;
}